

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::OptimalControlProblemPimpl::addCost
          (OptimalControlProblemPimpl *this,double weight,TimeRange *timeRange,
          shared_ptr<iDynTree::optimalcontrol::Cost> *cost,bool isLinear,bool isQuadratic,
          string *methodName)

{
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  byte in_CL;
  __shared_ptr *in_RDX;
  undefined8 *in_RSI;
  anon_struct_560_16_3a89ef90 *in_RDI;
  byte in_R8B;
  undefined8 in_XMM0_Qa;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TimedCost>_>::value,_pair<iterator,_bool>_>
  _Var8;
  ostringstream errorMsg;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_bool>
  costResult;
  TimedCost newCost;
  shared_ptr<iDynTree::optimalcontrol::Cost> *in_stack_fffffffffffff908;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>
  *in_stack_fffffffffffff910;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>
  *in_stack_fffffffffffff918;
  anon_struct_560_16_3a89ef90 *in_stack_fffffffffffff920;
  undefined7 in_stack_fffffffffffff928;
  undefined1 in_stack_fffffffffffff92f;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>
  *in_stack_fffffffffffff930;
  string local_690 [32];
  ostringstream local_670 [376];
  _Base_ptr local_4f8;
  undefined1 local_4f0;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_bool>
  local_298;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_bool>
  local_288 [14];
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined1 local_188;
  byte local_180;
  byte local_17f;
  byte local_2a;
  byte local_29;
  undefined8 *local_20;
  undefined8 local_18;
  byte local_1;
  
  local_29 = in_CL & 1;
  local_2a = in_R8B & 1;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    anon_struct_560_16_3a89ef90::TimedCost(in_RDI);
    std::shared_ptr<iDynTree::optimalcontrol::Cost>::operator=
              ((shared_ptr<iDynTree::optimalcontrol::Cost> *)in_stack_fffffffffffff910,
               in_stack_fffffffffffff908);
    local_1a0 = local_18;
    local_198 = *local_20;
    local_190 = local_20[1];
    local_188 = *(undefined1 *)(local_20 + 2);
    local_180 = local_29 & 1;
    local_17f = local_2a & 1;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->field_0x18);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x304e65);
      DynamicalSystem::stateSpaceSize(peVar3);
      peVar3 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x304e82);
      DynamicalSystem::controlSpaceSize(peVar3);
      anon_struct_560_16_3a89ef90::resizeBuffers<unsigned_long>
                (in_stack_fffffffffffff920,(unsigned_long)in_stack_fffffffffffff918,
                 (unsigned_long)in_stack_fffffffffffff910);
    }
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_bool>
    ::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_bool,_true>
              ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_bool>
                *)in_stack_fffffffffffff910);
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x304eec);
    Cost::name_abi_cxx11_(peVar4);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>
    ::pair<iDynTree::optimalcontrol::TimedCost_&,_true>
              (in_stack_fffffffffffff930,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff92f,in_stack_fffffffffffff928),
               in_stack_fffffffffffff920);
    _Var8 = std::
            map<std::__cxx11::string,iDynTree::optimalcontrol::TimedCost,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::optimalcontrol::TimedCost>>>
            ::insert<std::pair<std::__cxx11::string,iDynTree::optimalcontrol::TimedCost>>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
                        *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    local_4f8 = (_Base_ptr)_Var8.first._M_node;
    local_4f0 = _Var8.second;
    local_298.first._M_node = local_4f8;
    local_298.second = (bool)local_4f0;
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_bool>
    ::operator=(local_288,&local_298);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>
    ::~pair(in_stack_fffffffffffff910);
    if ((local_288[0].second & 1U) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_670);
      poVar5 = std::operator<<((ostream *)local_670,"A cost named ");
      peVar4 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x304fce);
      psVar6 = Cost::name_abi_cxx11_(peVar4);
      in_stack_fffffffffffff910 =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>
            *)std::operator<<(poVar5,(string *)psVar6);
      std::operator<<((ostream *)in_stack_fffffffffffff910," already exists.");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("OptimalControlProblem",pcVar2,pcVar7);
      std::__cxx11::string::~string(local_690);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_670);
    }
    else {
      local_1 = 1;
    }
    anon_struct_560_16_3a89ef90::~TimedCost
              ((anon_struct_560_16_3a89ef90 *)in_stack_fffffffffffff910);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("OptimalControlProblem",pcVar2,"Empty cost pointer");
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool addCost(double weight, const TimeRange& timeRange, std::shared_ptr<Cost> cost, bool isLinear, bool isQuadratic, const std::string& methodName) {
                if (!cost){
                    reportError("OptimalControlProblem", methodName.c_str(), "Empty cost pointer");
                    return false;
                }

                TimedCost newCost;
                newCost.cost = cost;
                newCost.weight = weight;
                newCost.timeRange = timeRange;
                newCost.isLinear = isLinear;
                newCost.isQuadratic = isQuadratic;

                if (dynamicalSystem){
                    newCost.resizeBuffers(dynamicalSystem->stateSpaceSize(), dynamicalSystem->controlSpaceSize());
                }

                std::pair<CostsMap::iterator, bool> costResult;
                costResult = costs.insert(std::pair<std::string, TimedCost>(cost->name(), newCost));
                if(!costResult.second){
                    std::ostringstream errorMsg;
                    errorMsg << "A cost named " << cost->name() <<" already exists.";
                    reportError("OptimalControlProblem", methodName.c_str(), errorMsg.str().c_str());
                    return false;
                }
                return true;
            }